

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O0

size_type fs_absolute(char *path,char *base,bool expand_tilde,char *out,size_type buffer_size)

{
  size_type sVar1;
  string_view local_80;
  string_view local_70;
  string local_60;
  string_view local_40;
  size_type local_30;
  size_type buffer_size_local;
  char *out_local;
  char *pcStack_18;
  bool expand_tilde_local;
  char *base_local;
  char *path_local;
  
  local_30 = buffer_size;
  buffer_size_local = (size_type)out;
  out_local._7_1_ = expand_tilde;
  pcStack_18 = base;
  base_local = path;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,path);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,pcStack_18);
  fs_absolute_abi_cxx11_(&local_60,local_70,local_80,(bool)(out_local._7_1_ & 1));
  local_40 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  sVar1 = fs_str2char(local_40,(char *)buffer_size_local,local_30);
  std::__cxx11::string::~string((string *)&local_60);
  return sVar1;
}

Assistant:

std::string::size_type fs_absolute(const char* path, const char* base, const bool expand_tilde,
                          char* out, const std::string::size_type buffer_size){
  return fs_str2char(fs_absolute(path, base, expand_tilde), out, buffer_size);
}